

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O3

QStringList * __thiscall
QFileSystemTreeView::selection(QStringList *__return_storage_ptr__,QFileSystemTreeView *this)

{
  QForeachContainer<QList<QModelIndex>_> _container_219;
  QModelIndexList indexes;
  QArrayDataPointer<QModelIndex> local_88;
  QModelIndex *local_70;
  QModelIndex *local_68;
  undefined4 local_60;
  undefined1 local_58 [16];
  QModelIndex *local_48;
  long local_40;
  QArrayDataPointer<char16_t> local_38;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::selectedRows((int)local_58 + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_88.d = (Data *)local_58._8_8_;
  local_88.ptr = local_48;
  local_88.size = local_40;
  if ((Data *)local_58._8_8_ != (Data *)0x0) {
    LOCK();
    (((QArrayData *)local_58._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_58._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_70 = local_48;
  local_68 = local_48 + local_40;
  local_60 = 1;
  if (local_40 != 0) {
    do {
      QFileSystemModel::fileInfo((QModelIndex *)local_58);
      QFileInfo::absoluteFilePath();
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QString *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      QFileInfo::~QFileInfo((QFileInfo *)local_58);
      local_70 = local_70 + 1;
    } while (local_70 != local_68);
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QModelIndex> *)(local_58 + 8));
  return __return_storage_ptr__;
}

Assistant:

QStringList QFileSystemTreeView::selection() const {
    const QModelIndexList indexes = selectionModel()->selectedRows();
    QStringList selection;

    foreach (const QModelIndex &index, indexes) {
        selection << d->model->fileInfo(index).absoluteFilePath();
    }

    return selection;
}